

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,MessageLite *default_value)

{
  byte bVar1;
  int iVar2;
  LogMessage *pLVar3;
  undefined4 extraout_var;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  LogFinisher local_d1;
  LogMessage local_d0;
  LogMessage local_98;
  LogMessage local_60;
  _Base_ptr p_Var4;
  
  p_Var5 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var5->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < number]) {
    if (number <= (int)p_Var6[1]._M_color) {
      p_Var4 = p_Var6;
    }
  }
  p_Var6 = &p_Var5->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var5) && (p_Var6 = p_Var4, number < (int)p_Var4[1]._M_color))
  {
    p_Var6 = &p_Var5->_M_header;
  }
  p_Var4 = (_Base_ptr)default_value;
  if ((_Rb_tree_header *)p_Var6 != p_Var5) {
    if (*(char *)((long)&p_Var6[1]._M_left + 1) != '\0') {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1bb);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: ((iter->second).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_98,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    bVar1 = *(byte *)&p_Var6[1]._M_left;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x35);
      pLVar3 = LogMessage::operator<<
                         (&local_98,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_d0,pLVar3);
      LogMessage::~LogMessage(&local_98);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
      LogMessage::LogMessage
                (&local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1bb);
      pLVar3 = LogMessage::operator<<
                         (&local_d0,
                          "CHECK failed: (cpp_type((iter->second).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_d1,pLVar3);
      LogMessage::~LogMessage(&local_d0);
    }
    p_Var4 = p_Var6[1]._M_parent;
    if (((ulong)p_Var6[1]._M_left & 0x100000) != 0) {
      iVar2 = (*(*(_func_int ***)p_Var4)[3])(p_Var4,default_value);
      p_Var4 = (_Base_ptr)CONCAT44(extraout_var,iVar2);
    }
  }
  return (MessageLite *)p_Var4;
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(
    int number, const MessageLite& default_value) const {
  map<int, Extension>::const_iterator iter = extensions_.find(number);
  if (iter == extensions_.end()) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    GOOGLE_DCHECK_TYPE(iter->second, OPTIONAL, MESSAGE);
    if (iter->second.is_lazy) {
      return iter->second.lazymessage_value->GetMessage(default_value);
    } else {
      return *iter->second.message_value;
    }
  }
}